

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_wrapper.hpp
# Opt level: O1

double convert<double>(char *str)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  undefined8 uVar3;
  allocator local_51;
  double local_50;
  long *local_48;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string((string *)local_40,str,&local_51);
  __nptr = local_40[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  local_50 = strtod((char *)__nptr,(char **)&local_48);
  if (local_48 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stod");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    convert<double>();
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_00109e16;
    local_50 = (double)std::__throw_out_of_range("stod");
  }
  *piVar2 = iVar1;
LAB_00109e16:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return local_50;
}

Assistant:

inline double convert<double>(const char* str) { return std::stod(str); }